

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-exec.c
# Opt level: O1

int cpu_exec_m68k(uc_struct_conflict3 *uc,CPUState *cpu)

{
  uc_struct_conflict7 *puVar1;
  void *pvVar2;
  CPUWatchpoint *pCVar3;
  CPUClass *pCVar4;
  TranslationBlock *pTVar5;
  long lVar6;
  undefined8 uVar7;
  _func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *p_Var8;
  _func_void_CPUState_ptr_vaddr_conflict *p_Var9;
  _Bool _Var10;
  byte bVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  TranslationBlock *pTVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  TranslationBlock_conflict *pTVar19;
  TranslationBlock_conflict *pTVar20;
  uint uVar21;
  uint cf_mask;
  uint32_t cflags;
  CPUClass *pCVar22;
  TranslationBlock_conflict *pTVar23;
  uc_struct_conflict3 *puVar24;
  list_item *plVar25;
  bool bVar26;
  uc_tb cur_tb;
  ulong local_50;
  undefined2 local_48;
  undefined2 local_46;
  ulong local_40;
  uint16_t local_38;
  uint16_t local_36;
  
  pCVar22 = cpu->cc;
  if (cpu->halted != 0) {
    if (pCVar22->has_work == (_func__Bool_CPUState_ptr_conflict *)0x0) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                 ,0x1bc,"cc->has_work");
    }
    _Var10 = (*pCVar22->has_work)((CPUState_conflict *)cpu);
    if (!_Var10) {
      return 0x10003;
    }
    cpu->halted = 0;
  }
  (*pCVar22->cpu_exec_enter)((CPUState_conflict *)cpu);
  iVar12 = __sigsetjmp(uc->exits + (long)uc->nested_level * 0x19 + 0x33,0);
  puVar24 = uc;
  if (iVar12 != 0) {
    pCVar22 = cpu->cc;
  }
  do {
    uVar18 = (uint)puVar24;
    puVar1 = cpu->uc;
    if ((puVar1->stop_interrupt == (uc_args_int_t_conflict7)0x0) ||
       (_Var10 = (*puVar1->stop_interrupt)(puVar1,cpu->exception_index), !_Var10)) {
      uVar21 = cpu->exception_index;
      if ((int)uVar21 < 0) {
        bVar26 = false;
      }
      else if ((int)uVar21 < 0x10000) {
        bVar26 = false;
        for (plVar25 = puVar1->hook[0].head;
            (plVar25 != (list_item *)0x0 && (pvVar2 = plVar25->data, pvVar2 != (void *)0x0));
            plVar25 = plVar25->next) {
          if (*(char *)((long)pvVar2 + 0x14) == '\0') {
            (**(code **)((long)pvVar2 + 0x28))
                      (puVar1,cpu->exception_index,*(undefined8 *)((long)pvVar2 + 0x30));
            bVar26 = true;
          }
        }
        if (bVar26) {
          cpu->exception_index = -1;
          uVar18 = 0x10000;
        }
        else {
          puVar1->invalid_error = 0x15;
          cpu->halted = 1;
          uVar18 = 0x10001;
        }
        bVar26 = (bool)(bVar26 ^ 1);
      }
      else {
        if (uVar21 == 0x10002) {
          pCVar4 = cpu->cc;
          if (cpu->watchpoint_hit == (CPUWatchpoint *)0x0) {
            for (pCVar3 = (cpu->watchpoints).tqh_first; pCVar3 != (CPUWatchpoint *)0x0;
                pCVar3 = (pCVar3->entry).tqe_next) {
              *(byte *)&pCVar3->flags = (byte)pCVar3->flags & 0x3f;
            }
          }
          (*pCVar4->debug_excp_handler)((CPUState_conflict *)cpu);
        }
        cpu->exception_index = -1;
        bVar26 = true;
        uVar18 = uVar21;
      }
    }
    else {
      plVar25 = puVar1->hook[0xe].head;
      if (plVar25 == (list_item *)0x0) {
LAB_006e220c:
        puVar1->invalid_error = 10;
      }
      else {
        bVar11 = 0;
        while (pvVar2 = plVar25->data, pvVar2 != (void *)0x0) {
          if (((*(char *)((long)pvVar2 + 0x14) == '\0') &&
              (bVar11 = (**(code **)((long)pvVar2 + 0x28))
                                  (puVar1,*(undefined8 *)((long)pvVar2 + 0x30)), bVar11 != 0)) ||
             (plVar25 = plVar25->next, plVar25 == (list_item *)0x0)) break;
        }
        if ((bVar11 & 1) == 0) goto LAB_006e220c;
      }
      bVar26 = true;
      uVar18 = 0x10001;
    }
    if (bVar26) {
      uc->cpu->tcg_exit_req = 0;
      (*pCVar22->cpu_exec_exit)((CPUState_conflict *)cpu);
      return uVar18;
    }
    pTVar20 = (TranslationBlock_conflict *)0x0;
    pTVar19 = pTVar20;
LAB_006e2316:
    pCVar4 = cpu->cc;
    *(undefined2 *)((long)cpu[1].tb_jmp_cache + 0x46a) = 0;
    uVar21 = cpu->interrupt_request;
    if (uVar21 == 0) {
LAB_006e2331:
      if (cpu->exit_request == true) {
        cpu->exit_request = false;
        bVar26 = true;
        if (cpu->exception_index == -1) {
          cpu->exception_index = 0x10000;
        }
      }
      else {
        bVar26 = false;
      }
    }
    else {
      uVar13 = uVar21;
      if ((cpu->singlestep_enabled & 2) != 0) {
        uVar13 = uVar21 & 0xffffeda5;
      }
      if ((char)uVar13 < '\0') {
        cpu->interrupt_request = uVar21 & 0xffffff7f;
        cpu->exception_index = 0x10002;
      }
      else {
        if ((uVar13 >> 10 & 1) == 0) {
          _Var10 = (*pCVar4->cpu_exec_interrupt)((CPUState_conflict *)cpu,uVar13);
          if (_Var10) {
            cpu->exception_index = -1;
            pTVar19 = (TranslationBlock_conflict *)0x0;
          }
          if ((cpu->interrupt_request & 4) != 0) {
            cpu->interrupt_request = cpu->interrupt_request & 0xfffffffb;
            pTVar19 = (TranslationBlock_conflict *)0x0;
          }
          goto LAB_006e2331;
        }
        cpu_reset(cpu);
      }
      bVar26 = true;
    }
    if (!bVar26) {
      cflags = cpu->cflags_next_tb;
      if (cflags == 0xffffffff) {
        cflags = 0;
      }
      else {
        cpu->cflags_next_tb = 0xffffffff;
      }
      pvVar2 = cpu->env_ptr;
      uVar21 = *(uint *)((long)pvVar2 + 0x40);
      uVar13 = *(uint *)((long)pvVar2 + 0x138) >> 4 & 0xf;
      if ((*(byte *)((long)pvVar2 + 0x45) & 0x20) != 0) {
        uVar13 = uVar13 + ((*(uint *)((long)pvVar2 + 0x180) & 4) << 0xd |
                          (*(uint *)((long)pvVar2 + 0x17c) & 4) << 0xc) + 0x2000;
      }
      puVar1 = cpu->uc;
      uVar14 = uVar21 >> 6 ^ uVar21;
      uVar14 = uVar14 & 0x3f | uVar14 >> 6 & 0xfc0;
      pTVar15 = cpu->tb_jmp_cache[uVar14];
      cf_mask = cpu->cluster_index << 0x18 | cflags & 0xffffff;
      if ((((pTVar15 == (TranslationBlock *)0x0) || ((uint)pTVar15->pc != uVar21)) ||
          ((*(target_ulong_conflict *)((long)&pTVar15->pc + 4) != 0 ||
           (((uint32_t)pTVar15->cs_base != uVar13 ||
            (cpu->trace_dstate[0] != (ulong)*(uint *)&pTVar15->size)))))) ||
         ((pTVar15->flags & 0xff0effff) != cf_mask)) {
        pTVar15 = tb_htable_lookup_m68k(cpu,(ulong)uVar21,0,uVar13,cf_mask);
        if (pTVar15 == (TranslationBlock *)0x0) {
          pTVar15 = (TranslationBlock *)0x0;
        }
        else {
          cpu->tb_jmp_cache[uVar14] = pTVar15;
        }
      }
      if (pTVar15 == (TranslationBlock *)0x0) {
        pTVar15 = (TranslationBlock *)tb_gen_code_m68k(cpu,uVar21,0,uVar13,cflags);
        cpu->tb_jmp_cache[uVar14] = pTVar15;
        pTVar5 = puVar1->last_tb;
        if (pTVar5 != (TranslationBlock *)0x0) {
          local_40 = (ulong)(uint)pTVar15->pc;
          local_38 = *(uint16_t *)((long)&pTVar15->cs_base + 6);
          local_36 = *(uint16_t *)((long)&pTVar15->cs_base + 4);
          local_50 = (ulong)(uint)pTVar5->pc;
          local_48 = *(undefined2 *)((long)&pTVar5->cs_base + 6);
          local_46 = *(undefined2 *)((long)&pTVar5->cs_base + 4);
          for (plVar25 = puVar1->hook[0xf].head;
              (plVar25 != (list_item *)0x0 && (pvVar2 = plVar25->data, pvVar2 != (void *)0x0));
              plVar25 = plVar25->next) {
            if (*(char *)((long)pvVar2 + 0x14) == '\0') {
              uVar16 = (ulong)(uint)pTVar15->pc;
              if (((*(ulong *)((long)pvVar2 + 0x18) <= uVar16) &&
                  (uVar16 <= *(ulong *)((long)pvVar2 + 0x20))) ||
                 (*(ulong *)((long)pvVar2 + 0x20) < *(ulong *)((long)pvVar2 + 0x18))) {
                (**(code **)((long)pvVar2 + 0x28))
                          (puVar1,&local_40,&local_50,*(undefined8 *)((long)pvVar2 + 0x30));
              }
            }
          }
        }
      }
      if ((pTVar19 != (TranslationBlock_conflict *)0x0) &&
         (pTVar15->page_addr[0] == 0xffffffffffffffff)) {
        if (1 < (uint)pTVar20) {
          __assert_fail("n < ARRAY_SIZE(tb->jmp_list_next)",
                        "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                        ,0xda,"void tb_add_jump(TranslationBlock *, int, TranslationBlock *)");
        }
        if ((pTVar15->flags & 0x40000) == 0) {
          LOCK();
          bVar26 = pTVar19->jmp_dest[(long)pTVar20] == 0;
          if (bVar26) {
            pTVar19->jmp_dest[(long)pTVar20] = (uintptr_t)pTVar15;
          }
          UNLOCK();
          if (bVar26) {
            pvVar2 = (pTVar19->tc).ptr;
            *(int *)(pTVar19->jmp_target_arg[(long)pTVar20] + (long)pvVar2) =
                 (*(int *)&((tb_tc *)&pTVar15->cflags)->ptr -
                 ((int)pTVar19->jmp_target_arg[(long)pTVar20] + (int)pvVar2)) + -4;
            pTVar19->jmp_list_next[(long)pTVar20] = pTVar15->jmp_target_arg[1];
            pTVar15->jmp_target_arg[1] = (ulong)pTVar19 | (ulong)pTVar20;
          }
        }
      }
      if (cpu->exit_request == false) {
        pvVar2 = cpu->env_ptr;
        tb_exec_lock_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx);
        uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x218) + 0x2e8) + 0x90))(pvVar2);
        if (cpu->uc->nested_level == 1) {
          tb_exec_unlock_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx);
        }
        cpu->can_do_io = 1;
        pTVar23 = (TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc);
        if ((uVar16 & 2) != 0) {
          if (*(long *)(*(long *)((long)pvVar2 + 0x218) + 0x358) == 0) {
            uVar21 = *(uint *)(*(long *)((long)pvVar2 + 0x218) + 0x578);
            if (((0x12 < uVar21) || ((0x771c0U >> (uVar21 & 0x1f) & 1) == 0)) &&
               (cpu->uc->quit_request == false)) {
              p_Var8 = cpu->cc->synchronize_from_tb;
              if (p_Var8 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                p_Var9 = cpu->cc->set_pc;
                if (p_Var9 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) goto LAB_006e2958;
                (*p_Var9)((CPUState_conflict *)cpu,(ulong)pTVar23->pc);
              }
              else {
                (*p_Var8)((CPUState_conflict *)cpu,pTVar23);
              }
            }
          }
          cpu->tcg_exit_req = 0;
        }
        cpu->uc->last_tb = pTVar15;
        uVar21 = (uint)uVar16 & 3;
        pTVar20 = (TranslationBlock_conflict *)(ulong)uVar21;
        pTVar19 = pTVar23;
        if (uVar21 == 3) {
          pTVar19 = (TranslationBlock_conflict *)0x0;
          pTVar20 = (TranslationBlock_conflict *)0x3;
          if (-1 < *(int *)(cpu[1].tb_jmp_cache + 0x8d)) {
            lVar6 = cpu->icount_budget;
            lVar17 = 0xffff;
            if (lVar6 < 0xffff) {
              lVar17 = lVar6;
            }
            uVar21 = (uint)lVar17;
            *(short *)(cpu[1].tb_jmp_cache + 0x8d) = (short)lVar17;
            cpu->icount_extra = lVar6 - (int)uVar21;
            pTVar19 = (TranslationBlock_conflict *)0x0;
            pTVar20 = (TranslationBlock_conflict *)0x3;
            if (0 < (int)uVar21 && lVar6 - (int)uVar21 == 0) {
              uVar13 = 0x7fff;
              if ((int)uVar21 < 0x7fff) {
                uVar13 = uVar21;
              }
              pTVar15 = (TranslationBlock *)
                        tb_gen_code_m68k(cpu,pTVar23->pc,pTVar23->cs_base,pTVar23->flags,
                                         uVar13 | 0x10000);
              (pTVar15->tc).size = (size_t)pTVar23;
              pvVar2 = cpu->env_ptr;
              uVar7._0_4_ = pTVar15->cflags;
              uVar7._4_4_ = pTVar15->trace_vcpu_dstate;
              tb_exec_lock_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx);
              uVar16 = (**(code **)(*(long *)(*(long *)((long)pvVar2 + 0x218) + 0x2e8) + 0x90))
                                 (pvVar2,uVar7);
              if (cpu->uc->nested_level == 1) {
                tb_exec_unlock_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx);
              }
              cpu->can_do_io = 1;
              if ((uVar16 & 2) != 0) {
                if (*(long *)(*(long *)((long)pvVar2 + 0x218) + 0x358) == 0) {
                  uVar21 = *(uint *)(*(long *)((long)pvVar2 + 0x218) + 0x578);
                  if (((0x12 < uVar21) || ((0x771c0U >> (uVar21 & 0x1f) & 1) == 0)) &&
                     (cpu->uc->quit_request == false)) {
                    p_Var8 = cpu->cc->synchronize_from_tb;
                    if (p_Var8 == (_func_void_CPUState_ptr_TranslationBlock_ptr_conflict1 *)0x0) {
                      p_Var9 = cpu->cc->set_pc;
                      if (p_Var9 == (_func_void_CPUState_ptr_vaddr_conflict *)0x0) {
LAB_006e2958:
                        __assert_fail("cc->set_pc",
                                      "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cpu-exec.c"
                                      ,0x61,
                                      "tcg_target_ulong cpu_tb_exec(CPUState *, TranslationBlock *)"
                                     );
                      }
                      (*p_Var9)((CPUState_conflict *)cpu,
                                (ulong)((TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc))
                                       ->pc);
                    }
                    else {
                      (*p_Var8)((CPUState_conflict *)cpu,
                                (TranslationBlock_conflict *)(uVar16 & 0xfffffffffffffffc));
                    }
                  }
                }
                cpu->tcg_exit_req = 0;
              }
              tb_phys_invalidate_m68k
                        ((TCGContext_conflict2 *)cpu->uc->tcg_ctx,
                         (TranslationBlock_conflict *)pTVar15,0xffffffffffffffff);
              tcg_tb_remove_m68k((TCGContext_conflict2 *)cpu->uc->tcg_ctx,pTVar15);
              pTVar19 = (TranslationBlock_conflict *)0x0;
              pTVar20 = (TranslationBlock_conflict *)0x3;
            }
          }
        }
      }
      goto LAB_006e2316;
    }
    puVar24 = (uc_struct_conflict3 *)(ulong)uVar18;
  } while( true );
}

Assistant:

int cpu_exec(struct uc_struct *uc, CPUState *cpu)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret;
    // SyncClocks sc = { 0 };

    if (cpu_handle_halt(cpu)) {
        return EXCP_HALTED;
    }

    // rcu_read_lock();

    cc->cpu_exec_enter(cpu);

    /* Calculate difference between guest clock and host clock.
     * This delay includes the delay of the last cycle, so
     * what we have to do is sleep until it is 0. As for the
     * advance/delay we gain here, we try to fix it next time.
     */
    // init_delay_params(&sc, cpu);

    // Unicorn: We would like to support nested uc_emu_start calls.
    /* prepare setjmp context for exception handling */
    // if (sigsetjmp(cpu->jmp_env, 0) != 0) {
    if (sigsetjmp(uc->jmp_bufs[uc->nested_level - 1], 0) != 0) {
#if defined(__clang__) || !QEMU_GNUC_PREREQ(4, 6)
        /* Some compilers wrongly smash all local variables after
         * siglongjmp. There were bug reports for gcc 4.5.0 and clang.
         * Reload essential local variables here for those compilers.
         * Newer versions of gcc would complain about this code (-Wclobbered). */
        cc = CPU_GET_CLASS(cpu);
#else /* buggy compiler */
        /* Assert that the compiler does not smash local variables. */
        // g_assert(cpu == current_cpu);
        g_assert(cc == CPU_GET_CLASS(cpu));
#endif /* buggy compiler */

        assert_no_pages_locked();
    }

    /* if an exception is pending, we execute it here */
    while (!cpu_handle_exception(cpu, &ret)) {
        TranslationBlock *last_tb = NULL;
        int tb_exit = 0;

        while (!cpu_handle_interrupt(cpu, &last_tb)) {
            uint32_t cflags = cpu->cflags_next_tb;
            TranslationBlock *tb;

            /* When requested, use an exact setting for cflags for the next
               execution.  This is used for icount, precise smc, and stop-
               after-access watchpoints.  Since this request should never
               have CF_INVALID set, -1 is a convenient invalid value that
               does not require tcg headers for cpu_common_reset.  */
            if (cflags == -1) {
                cflags = curr_cflags();
            } else {
                cpu->cflags_next_tb = -1;
            }

            tb = tb_find(cpu, last_tb, tb_exit, cflags);
            if (unlikely(cpu->exit_request)) {
                continue;
            }
            cpu_loop_exec_tb(cpu, tb, &last_tb, &tb_exit);
            /* Try to align the host and virtual clocks
               if the guest is in advance */
            // align_clocks(&sc, cpu);
        }
    }

    // Unicorn: Clear any TCG exit flag that might have been left set by exit requests
    uc->cpu->tcg_exit_req = 0;

    cc->cpu_exec_exit(cpu);
    // rcu_read_unlock();

    return ret;
}